

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::Datum::Datum(Datum *this,Datum *from)

{
  int new_size;
  void *pvVar1;
  string *initial_value;
  int32 iVar2;
  int32 iVar3;
  int32 iVar4;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Datum_006f83c0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  (this->float_data_).current_size_ = 0;
  *(undefined8 *)&(this->float_data_).total_size_ = 0;
  *(undefined4 *)((long)&(this->float_data_).rep_ + 4) = 0;
  new_size = (from->float_data_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->float_data_,new_size);
    memcpy(((this->float_data_).rep_)->elements,((from->float_data_).rep_)->elements,
           (long)(from->float_data_).current_size_ << 2);
    (this->float_data_).current_size_ = (from->float_data_).current_size_;
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->data_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (initial_value = (from->data_).ptr_,
     initial_value != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_))
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->data_,initial_value);
  }
  this->encoded_ = from->encoded_;
  iVar2 = from->height_;
  iVar3 = from->width_;
  iVar4 = from->label_;
  this->channels_ = from->channels_;
  this->height_ = iVar2;
  this->width_ = iVar3;
  this->label_ = iVar4;
  return;
}

Assistant:

Datum::Datum(const Datum& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      float_data_(from.float_data_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  data_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_data()) {
    data_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.data_);
  }
  ::memcpy(&channels_, &from.channels_,
    reinterpret_cast<char*>(&encoded_) -
    reinterpret_cast<char*>(&channels_) + sizeof(encoded_));
  // @@protoc_insertion_point(copy_constructor:caffe.Datum)
}